

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

uint32_t FAudioSourceVoice_SetSourceSampleRate
                   (FAudioSourceVoice *voice,uint32_t NewSourceSampleRate)

{
  ushort uVar1;
  FAudioVoice *pFVar2;
  uint32_t uVar3;
  FAudioMutex *ppvVar4;
  double dVar5;
  
  FAudio_PlatformLockMutex((voice->field_19).src.bufferLock);
  if ((voice->audio->version < 8) || ((voice->field_19).src.bufferList == (FAudioBufferEntry *)0x0))
  {
    FAudio_PlatformUnlockMutex((voice->field_19).src.bufferLock);
    ((voice->field_19).src.format)->nSamplesPerSec = NewSourceSampleRate;
    dVar5 = (double)SDL_ceil(((double)NewSourceSampleRate *
                             (double)(voice->field_19).src.maxFreqRatio *
                             (double)voice->audio->updateSize) /
                             (double)(voice->audio->master->field_19).master.inputSampleRate);
    uVar1 = ((voice->field_19).src.format)->nChannels;
    FAudio_INTERNAL_ResizeDecodeCache
              (voice->audio,((int)(long)dVar5 + (uint)uVar1 * 2 + 2) * (uint)uVar1);
    (voice->field_19).src.decodeSamples = (int)(long)dVar5 + (uint)uVar1 * 2;
    ppvVar4 = &voice->sendLock;
    FAudio_PlatformLockMutex(voice->sendLock);
    uVar3 = 0;
    if ((voice->sends).SendCount != 0) {
      pFVar2 = ((voice->sends).pSends)->pOutputVoice;
      dVar5 = (double)SDL_ceil(((double)*(uint *)((long)&pFVar2->field_19 +
                                                 (ulong)(pFVar2->type != FAUDIO_VOICE_MASTER) * 0x10
                                                 + 0x14) * (double)voice->audio->updateSize) /
                               (double)(voice->audio->master->field_19).master.inputSampleRate);
      (voice->field_19).src.resampleSamples = (uint32_t)(long)dVar5;
    }
  }
  else {
    ppvVar4 = &(voice->field_19).src.bufferLock;
    uVar3 = 0x88960001;
  }
  FAudio_PlatformUnlockMutex(*ppvVar4);
  return uVar3;
}

Assistant:

uint32_t FAudioSourceVoice_SetSourceSampleRate(
	FAudioSourceVoice *voice,
	uint32_t NewSourceSampleRate
) {
	uint32_t outSampleRate;
	uint32_t newDecodeSamples, newResampleSamples;

	LOG_API_ENTER(voice->audio)
	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);
	FAudio_assert(	NewSourceSampleRate >= FAUDIO_MIN_SAMPLE_RATE &&
			NewSourceSampleRate <= FAUDIO_MAX_SAMPLE_RATE	);

	FAudio_PlatformLockMutex(voice->src.bufferLock);
	LOG_MUTEX_LOCK(voice->audio, voice->src.bufferLock)
	if (	voice->audio->version > 7 &&
		voice->src.bufferList != NULL	)
	{
		FAudio_PlatformUnlockMutex(voice->src.bufferLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}
	FAudio_PlatformUnlockMutex(voice->src.bufferLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)

	voice->src.format->nSamplesPerSec = NewSourceSampleRate;

	/* Resize decode cache */
	newDecodeSamples = (uint32_t) FAudio_ceil(
		voice->audio->updateSize *
		(double) voice->src.maxFreqRatio *
		(double) NewSourceSampleRate /
		(double) voice->audio->master->master.inputSampleRate
	) + EXTRA_DECODE_PADDING * voice->src.format->nChannels;
	FAudio_INTERNAL_ResizeDecodeCache(
		voice->audio,
		(newDecodeSamples + EXTRA_DECODE_PADDING) * voice->src.format->nChannels
	);
	voice->src.decodeSamples = newDecodeSamples;

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	if (voice->sends.SendCount == 0)
	{
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return 0;
	}
	outSampleRate = voice->sends.pSends[0].pOutputVoice->type == FAUDIO_VOICE_MASTER ?
		voice->sends.pSends[0].pOutputVoice->master.inputSampleRate :
		voice->sends.pSends[0].pOutputVoice->mix.inputSampleRate;

	newResampleSamples = (uint32_t) (FAudio_ceil(
		(double) voice->audio->updateSize *
		(double) outSampleRate /
		(double) voice->audio->master->master.inputSampleRate
	));
	voice->src.resampleSamples = newResampleSamples;

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)

	LOG_API_EXIT(voice->audio)
	return 0;
}